

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  undefined8 uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar8;
  type_conflict5 tVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  long lVar11;
  long lVar12;
  undefined4 in_stack_00000064;
  int j_2;
  undefined1 local_431;
  int *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_410;
  int *local_408;
  int *local_400;
  int j_1;
  ulong uStack_3f0;
  uint local_3e8 [2];
  uint auStack_3e0 [2];
  uint local_3d8 [2];
  int local_3d0;
  bool local_3cc;
  undefined8 local_3c8;
  int j;
  uint auStack_3b0 [2];
  uint local_3a8 [2];
  uint auStack_3a0 [2];
  uint local_398 [2];
  int local_390;
  bool local_38c;
  undefined8 local_388;
  int *local_378;
  int *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)eps2.m_backend._40_8_;
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x20);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._40_8_;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 8);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x10);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x18);
  local_e8.m_backend.exp = *(int *)(eps2.m_backend._40_8_ + 0x28);
  local_e8.m_backend.neg = *(bool *)(eps2.m_backend._40_8_ + 0x2c);
  local_e8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x30);
  local_420 = rhs;
  local_418 = eps;
  local_408 = idx;
  vSolveLright3(this,rhs,ridx,&rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_a8,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend._48_8_,(int *)rhs2,(int *)&ridx2,&local_e8);
  pnVar7 = local_420;
  local_428 = vec;
  local_410 = this;
  local_400 = ridx;
  if (CONCAT44(in_stack_00000064,rn2) == 0) {
    local_430 = (this->row).perm;
    _j_1 = _j_1 & 0xffffffff00000000;
    for (lVar11 = 0; lVar11 < rn; lVar11 = lVar11 + 1) {
      iVar2 = ridx[lVar11];
      local_2e8.m_backend.exp = pnVar7[iVar2].m_backend.exp;
      local_2e8.m_backend.neg = pnVar7[iVar2].m_backend.neg;
      local_2e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar7[iVar2].m_backend.data._M_elems + 8);
      local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)pnVar7[iVar2].m_backend.data._M_elems
      ;
      local_2e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar7[iVar2].m_backend.data._M_elems + 2);
      puVar1 = pnVar7[iVar2].m_backend.data._M_elems + 4;
      local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_2e8.m_backend.fpclass = pnVar7[iVar2].m_backend.fpclass;
      local_2e8.m_backend.prec_elem = pnVar7[iVar2].m_backend.prec_elem;
      local_328.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_418->m_backend).data._M_elems;
      local_328.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 2);
      local_328.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 4);
      local_328.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 6);
      local_328.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 8);
      local_328.m_backend.exp = (local_418->m_backend).exp;
      local_328.m_backend.neg = (local_418->m_backend).neg;
      local_328.m_backend.fpclass = (local_418->m_backend).fpclass;
      local_328.m_backend.prec_elem = (local_418->m_backend).prec_elem;
      bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2e8,&local_328);
      if (bVar8) {
        enQueueMax(ridx,&j_1,local_430[iVar2]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&pnVar7[iVar2].m_backend,0);
      }
    }
    rn = j_1;
  }
  else {
    local_378 = (int *)eps3.m_backend.data._M_elems._0_8_;
    local_370 = (this->row).perm;
    _j = _j & 0xffffffff00000000;
    for (lVar11 = 0; pnVar7 = local_420, lVar11 < rn; lVar11 = lVar11 + 1) {
      iVar2 = local_400[lVar11];
      lVar10 = (long)iVar2;
      lVar12 = lVar10 * 0x38;
      local_3d8 = *(uint (*) [2])(local_420[lVar10].m_backend.data._M_elems + 8);
      _j_1 = *(ulong *)local_420[lVar10].m_backend.data._M_elems;
      uStack_3f0 = *(ulong *)(local_420[lVar10].m_backend.data._M_elems + 2);
      puVar1 = local_420[lVar10].m_backend.data._M_elems + 4;
      local_3e8 = *(uint (*) [2])puVar1;
      auStack_3e0 = *(uint (*) [2])(puVar1 + 2);
      local_368.m_backend.exp = local_420[lVar10].m_backend.exp;
      local_431 = local_420[lVar10].m_backend.neg;
      fVar3 = local_420[lVar10].m_backend.fpclass;
      iVar4 = local_420[lVar10].m_backend.prec_elem;
      local_368.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(local_420[lVar10].m_backend.data._M_elems + 8);
      local_368.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)local_420[lVar10].m_backend.data._M_elems;
      local_368.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(local_420[lVar10].m_backend.data._M_elems + 2);
      puVar1 = local_420[lVar10].m_backend.data._M_elems + 4;
      local_368.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_368.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_430 = (int *)CONCAT44(local_430._4_4_,local_368.m_backend.exp);
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_418->m_backend).data._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 2);
      local_2a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 4);
      local_2a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 6);
      local_2a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_418->m_backend).data._M_elems + 8);
      local_2a8.m_backend.exp = (local_418->m_backend).exp;
      local_2a8.m_backend.neg = (local_418->m_backend).neg;
      local_2a8.m_backend.fpclass = (local_418->m_backend).fpclass;
      local_2a8.m_backend.prec_elem = (local_418->m_backend).prec_elem;
      local_368.m_backend.neg = (bool)local_431;
      local_368.m_backend.fpclass = fVar3;
      local_368.m_backend.prec_elem = iVar4;
      bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_368,&local_2a8);
      if (bVar8) {
        *local_378 = iVar2;
        local_378 = local_378 + 1;
        enQueueMax(local_400,&j,local_370[lVar10]);
        lVar10 = CONCAT44(in_stack_00000064,rn2);
        *(uint (*) [2])(lVar10 + 0x20 + lVar12) = local_3d8;
        puVar1 = (uint *)(lVar10 + 0x10 + lVar12);
        *(uint (*) [2])puVar1 = local_3e8;
        *(uint (*) [2])(puVar1 + 2) = auStack_3e0;
        *(ulong *)(lVar10 + lVar12) = _j_1;
        ((ulong *)(lVar10 + lVar12))[1] = uStack_3f0;
        *(undefined4 *)(lVar10 + 0x28 + lVar12) = local_430._0_4_;
        *(undefined1 *)(lVar10 + 0x2c + lVar12) = local_431;
        *(fpclass_type *)(lVar10 + 0x30 + lVar12) = fVar3;
        *(int32_t *)(lVar10 + 0x34 + lVar12) = iVar4;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&pnVar7[lVar10].m_backend,0);
      }
      b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)eps2.m_backend._40_8_;
    }
    rn = j;
    (vec3->m_backend).data._M_elems[0] = j;
  }
  uVar6 = eps2.m_backend.data._M_elems._16_8_;
  if ((double)(int)eps2.m_backend.data._M_elems[6] <= (double)local_410->thedim * 0.2) {
    local_430 = (local_410->row).perm;
    j_2 = 0;
    for (lVar11 = 0; lVar11 < (int)eps2.m_backend.data._M_elems[6]; lVar11 = lVar11 + 1) {
      lVar12 = (long)*(int *)(uVar6 + lVar11 * 4);
      lVar10 = lVar12 * 0x38;
      local_3d8 = *(uint (*) [2])(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar10);
      _j_1 = *(ulong *)(eps2.m_backend.data._M_elems._8_8_ + lVar10);
      uStack_3f0 = ((ulong *)(eps2.m_backend.data._M_elems._8_8_ + lVar10))[1];
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar10);
      local_3e8 = *(uint (*) [2])puVar1;
      auStack_3e0 = *(uint (*) [2])(puVar1 + 2);
      local_3d0 = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x28 + lVar10);
      local_3cc = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x2c + lVar10);
      local_3c8 = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar10);
      local_398 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x20);
      _j = *(ulong *)eps2.m_backend.data._M_elems._0_8_;
      auStack_3b0 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 8);
      local_3a8 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x10);
      auStack_3a0 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x18);
      local_390 = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
      local_38c = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
      local_388 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
      if ((fpclass_type)local_388 != cpp_dec_float_finite || j != 0) {
        local_38c = (bool)(local_38c ^ 1);
      }
      tVar9 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&j);
      if (tVar9) {
LAB_0025ac57:
        enQueueMax((int *)uVar6,&j_2,local_430[lVar12]);
      }
      else {
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)eps2.m_backend.data._M_elems._0_8_);
        if (tVar9) goto LAB_0025ac57;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(lVar10 + eps2.m_backend.data._M_elems._8_8_),0)
        ;
      }
    }
    eps2.m_backend.data._M_elems[6] = j_2;
  }
  else {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = local_410->thedim + -1;
  }
  if ((double)(int)ridx2 <= (double)local_410->thedim * 0.2) {
    local_430 = (local_410->row).perm;
    j_2 = 0;
    piVar5 = ridx2;
    for (lVar11 = 0; ridx2._4_4_ = (undefined4)((ulong)piVar5 >> 0x20), lVar11 < (int)ridx2;
        lVar11 = lVar11 + 1) {
      lVar12 = (long)(int)(rhs2->m_backend).data._M_elems[lVar11];
      lVar10 = lVar12 * 0x38;
      local_3d8 = *(uint (*) [2])(eps2.m_backend._48_8_ + 0x20 + lVar10);
      _j_1 = *(ulong *)(eps2.m_backend._48_8_ + lVar10);
      uStack_3f0 = ((ulong *)(eps2.m_backend._48_8_ + lVar10))[1];
      puVar1 = (uint *)(eps2.m_backend._48_8_ + 0x10 + lVar10);
      local_3e8 = *(uint (*) [2])puVar1;
      auStack_3e0 = *(uint (*) [2])(puVar1 + 2);
      local_3d0 = *(int *)(eps2.m_backend._48_8_ + 0x28 + lVar10);
      local_3cc = *(bool *)(eps2.m_backend._48_8_ + 0x2c + lVar10);
      local_3c8 = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30 + lVar10);
      local_398 = *(uint (*) [2])((b->m_backend).data._M_elems + 8);
      _j = *(ulong *)(b->m_backend).data._M_elems;
      auStack_3b0 = *(uint (*) [2])((b->m_backend).data._M_elems + 2);
      local_3a8 = *(uint (*) [2])((b->m_backend).data._M_elems + 4);
      auStack_3a0 = *(uint (*) [2])((b->m_backend).data._M_elems + 6);
      local_390 = (b->m_backend).exp;
      local_38c = (b->m_backend).neg;
      local_388._0_4_ = (b->m_backend).fpclass;
      local_388._4_4_ = (b->m_backend).prec_elem;
      if ((fpclass_type)local_388 != cpp_dec_float_finite || j != 0) {
        local_38c = (bool)(local_38c ^ 1);
      }
      ridx2 = piVar5;
      tVar9 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&j);
      if (tVar9) {
LAB_0025add6:
        enQueueMax((int *)rhs2,&j_2,local_430[lVar12]);
        piVar5 = ridx2;
      }
      else {
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&j_1,b);
        if (tVar9) goto LAB_0025add6;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(lVar10 + eps2.m_backend._48_8_),0);
        piVar5 = ridx2;
      }
      ridx2._0_4_ = (int)piVar5;
    }
    ridx2 = (int *)CONCAT44(ridx2._4_4_,j_2);
  }
  else {
    (rhs2->m_backend).data._M_elems[0] = local_410->thedim - 1;
  }
  piVar5 = local_408;
  this_00 = local_410;
  pnVar7 = local_418;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_418->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_418->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_418->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_418->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_418->m_backend).data._M_elems + 8);
  local_128.m_backend.exp = (local_418->m_backend).exp;
  local_128.m_backend.neg = (local_418->m_backend).neg;
  local_128.m_backend.fpclass = (local_418->m_backend).fpclass;
  local_128.m_backend.prec_elem = (local_418->m_backend).prec_elem;
  rn = vSolveUright(local_410,local_428,local_408,local_420,local_400,rn,&local_128);
  uVar6 = eps2.m_backend.data._M_elems._0_8_;
  local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_168.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_168.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_168.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_168.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_168.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_168.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  vSolveUrightNoNZ(this_00,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                   eps2.m_backend.data._M_elems[6],&local_168);
  local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(b->m_backend).data._M_elems;
  local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 2);
  local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 4);
  local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 6);
  local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 8);
  local_1a8.m_backend.exp = (b->m_backend).exp;
  local_1a8.m_backend.neg = (b->m_backend).neg;
  local_1a8.m_backend.fpclass = (b->m_backend).fpclass;
  local_1a8.m_backend.prec_elem = (b->m_backend).prec_elem;
  vSolveUrightNoNZ(this_00,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)eps2.m_backend.data._M_elems._32_8_,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend._48_8_,(int *)rhs2,(int)ridx2,&local_1a8);
  if ((this_00->l).updateType == 0) {
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar7->m_backend).data._M_elems + 2)
    ;
    local_1e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 6);
    local_1e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 8);
    local_1e8.m_backend.exp = (pnVar7->m_backend).exp;
    local_1e8.m_backend.neg = (pnVar7->m_backend).neg;
    local_1e8.m_backend.fpclass = (pnVar7->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (pnVar7->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,local_428,piVar5,rn,&local_1e8);
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar6;
    local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar6 + 8);
    local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar6 + 0x10);
    local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar6 + 0x18);
    local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar6 + 0x20);
    local_228.m_backend.exp = *(int *)(uVar6 + 0x28);
    local_228.m_backend.neg = *(bool *)(uVar6 + 0x2c);
    local_228.m_backend._48_8_ = *(undefined8 *)(uVar6 + 0x30);
    vSolveUpdateRightNoNZ(this_00,vec2,&local_228);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 8);
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(b->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 2);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 6);
    local_268.m_backend.exp = (b->m_backend).exp;
    local_268.m_backend.neg = (b->m_backend).neg;
    local_268.m_backend.fpclass = (b->m_backend).fpclass;
    local_268.m_backend.prec_elem = (b->m_backend).prec_elem;
    vSolveUpdateRightNoNZ
              (this_00,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend.data._M_elems._32_8_,&local_268);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}